

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

void __thiscall pegmatite::Input::Input(Input *this,Input *orig)

{
  pointer pcVar1;
  Index IVar2;
  
  this->_vptr_Input = (_func_int **)&PTR___cxa_pure_virtual_00157af0;
  (this->user_name)._M_dataplus._M_p = (pointer)&(this->user_name).field_2;
  pcVar1 = (orig->user_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->user_name,pcVar1,pcVar1 + (orig->user_name)._M_string_length);
  this->buffer = orig->buffer;
  IVar2 = orig->buffer_end;
  this->buffer_start = orig->buffer_start;
  this->buffer_end = IVar2;
  return;
}

Assistant:

Input::Input(const Input& orig)
	: user_name(orig.user_name), buffer(orig.buffer),
	  buffer_start(orig.buffer_start), buffer_end(orig.buffer_end) {}